

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall google::protobuf::compiler::Parser::Consume(Parser *this,char *text)

{
  bool bVar1;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = TryConsume(this,text);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,text,&local_81);
    std::operator+(&local_80,"Expected \"",&local_40);
    std::operator+(&local_60,&local_80,"\".");
    AddError(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

bool Parser::Consume(const char* text) {
  if (TryConsume(text)) {
    return true;
  } else {
    AddError("Expected \"" + string(text) + "\".");
    return false;
  }
}